

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::encodeArray
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,uint32_t *out,
          size_t *nvalue)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined4 *in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  ulong *in_R8;
  size_t *unaff_retaddr;
  uint32_t *in_stack_00000008;
  size_t in_stack_00000010;
  size_t thisnvalue;
  size_t thissize;
  size_t oldnvalue;
  uint32_t *finalin;
  uint32_t *initout;
  ulong local_60;
  undefined4 *local_20;
  ulong local_10;
  
  checkifdivisibleby((size_t)nvalue,initout._4_4_);
  uVar2 = in_RSI + in_RDX * 4;
  local_20 = in_RCX + 1;
  *in_RCX = (int)in_RDX;
  uVar1 = *in_R8;
  *in_R8 = 1;
  for (local_10 = in_RSI; local_10 != uVar2; local_10 = local_60 * 4 + local_10) {
    if (local_10 + (ulong)*(uint *)(in_RDI + 0x10) * 4 < uVar2) {
      local_60 = (ulong)*(uint *)(in_RDI + 0x10);
    }
    else {
      local_60 = (long)(uVar2 - local_10) >> 2;
    }
    lVar3 = uVar1 - ((long)local_20 - (long)in_RCX >> 2);
    __encodeArray((SimplePFor<FastPForLib::Simple8b<true>_> *)thissize,(uint32_t *)thisnvalue,
                  in_stack_00000010,in_stack_00000008,unaff_retaddr);
    *in_R8 = lVar3 + *in_R8;
    local_20 = local_20 + lVar3;
  }
  if (uVar1 < *in_R8) {
    fprintf(_stderr,
            "It is possible we have a buffer overrun. You reported having allocated %zu bytes for the compressed data but we needed %zu bytes. Please increase the available memory for compressed data or check the value of the last parameter provided to the encodeArray method.\n"
            ,uVar1 << 2,*in_R8 << 2);
  }
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) override {
    checkifdivisibleby(length, BlockSize);
    const uint32_t *const initout(out);
    const uint32_t *const finalin(in + length);

    *out++ = static_cast<uint32_t>(length);
    const size_t oldnvalue = nvalue;
    nvalue = 1;
    while (in != finalin) {
      size_t thissize = static_cast<size_t>(
          finalin > PageSize + in ? PageSize : (finalin - in));
      size_t thisnvalue = oldnvalue - (out - initout);
      __encodeArray(in, thissize, out, thisnvalue);
      nvalue += thisnvalue;
      out += thisnvalue;
      in += thissize;
    }
    assert(out == nvalue + initout);
    if (oldnvalue < nvalue)
      fprintf(stderr,
          "It is possible we have a buffer overrun. You reported having allocated "
          "%zu bytes for the compressed data but we needed "
          "%zu bytes. Please increase the available memory "
          "for compressed data or check the value of the last parameter provided "
          "to the encodeArray method.\n",
          oldnvalue * sizeof(uint32_t), nvalue * sizeof(uint32_t));
  }